

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_message.hpp
# Opt level: O1

iuStreamMessage * __thiscall
iutest::detail::iuStreamMessage::operator<<(iuStreamMessage *this,char (*value) [49])

{
  string local_38;
  
  PrintToString<char[49]>(&local_38,value);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&(this->m_stream).super_iu_stringstream.field_0x10,local_38._M_dataplus._M_p
             ,local_38._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

iuStreamMessage& operator << (const T(&value)[SIZE])
    {
        m_stream << PrintToString(value);
        return *this;
    }